

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseUserDefinedType(Parser *this,string *type_name)

{
  bool bVar1;
  Token *pTVar2;
  undefined1 local_88 [8];
  string identifier;
  allocator local_51;
  string local_50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_true>
  local_28;
  const_iterator iter;
  string *type_name_local;
  Parser *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_true>
               )type_name;
  std::__cxx11::string::clear();
  pTVar2 = io::Tokenizer::current(this->input_);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>
               *)(anonymous_namespace)::kTypeNames_abi_cxx11_,&pTVar2->text);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>
              *)(anonymous_namespace)::kTypeNames_abi_cxx11_);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"Expected message type.",&local_51);
    AddError(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    pTVar2 = io::Tokenizer::current(this->input_);
    std::__cxx11::string::operator=
              ((string *)
               iter.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_true>
               ._M_cur,(string *)&pTVar2->text);
    io::Tokenizer::Next(this->input_);
    this_local._7_1_ = true;
  }
  else {
    bVar1 = TryConsume(this,".");
    if (bVar1) {
      std::__cxx11::string::append
                ((char *)iter.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_true>
                         ._M_cur);
    }
    std::__cxx11::string::string((string *)local_88);
    bVar1 = ConsumeIdentifier(this,(string *)local_88,"Expected type name.");
    if (bVar1) {
      std::__cxx11::string::append
                ((string *)
                 iter.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_true>
                 ._M_cur);
      while (bVar1 = TryConsume(this,"."), bVar1) {
        std::__cxx11::string::append
                  ((char *)iter.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_true>
                           ._M_cur);
        bVar1 = ConsumeIdentifier(this,(string *)local_88,"Expected identifier.");
        if (!bVar1) {
          this_local._7_1_ = false;
          goto LAB_00639707;
        }
        std::__cxx11::string::append
                  ((string *)
                   iter.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_true>
                   ._M_cur);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
LAB_00639707:
    std::__cxx11::string::~string((string *)local_88);
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseUserDefinedType(std::string* type_name) {
  type_name->clear();

  TypeNameMap::const_iterator iter = kTypeNames.find(input_->current().text);
  if (iter != kTypeNames.end()) {
    // Note:  The only place enum types are allowed is for field types, but
    //   if we are parsing a field type then we would not get here because
    //   primitives are allowed there as well.  So this error message doesn't
    //   need to account for enums.
    AddError("Expected message type.");

    // Pretend to accept this type so that we can go on parsing.
    *type_name = input_->current().text;
    input_->Next();
    return true;
  }

  // A leading "." means the name is fully-qualified.
  if (TryConsume(".")) type_name->append(".");

  // Consume the first part of the name.
  std::string identifier;
  DO(ConsumeIdentifier(&identifier, "Expected type name."));
  type_name->append(identifier);

  // Consume more parts.
  while (TryConsume(".")) {
    type_name->append(".");
    DO(ConsumeIdentifier(&identifier, "Expected identifier."));
    type_name->append(identifier);
  }

  return true;
}